

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitboard.cpp
# Opt level: O2

void __thiscall bitboards::printStandardArrayBoard(bitboards *this)

{
  int i;
  long lVar1;
  char *pcVar2;
  int y;
  int iVar3;
  char array [64];
  char local_68 [72];
  
  pcVar2 = local_68;
  for (lVar1 = 0; lVar1 != 0x40; lVar1 = lVar1 + 1) {
    local_68[lVar1] = ' ';
  }
  convertToStandardArray(this,local_68);
  for (iVar3 = 0; iVar3 != 8; iVar3 = iVar3 + 1) {
    for (lVar1 = 0; lVar1 != 8; lVar1 = lVar1 + 1) {
      std::operator<<((ostream *)&std::cout,pcVar2[lVar1]);
    }
    std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
    pcVar2 = pcVar2 + 8;
  }
  return;
}

Assistant:

void bitboards::printStandardArrayBoard() {
  char array[64];
  for (int i=0; i < 64; i++) {
    array[i] = ' ';
  }

  convertToStandardArray(array);

  int i = 0;
  for(int y = 0; y < 8; y++) {
    for(int x = 0; x < 8; x++, i++) {
      std::cout << array[i];
    }
    std::cout << std::endl;
  }
}